

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

bool __thiscall BackwardPass::IsEmptyLoopAfterMemOp(BackwardPass *this,Loop *loop)

{
  OpCode OVar1;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  code *pcVar2;
  BasicBlock **this_01;
  bool bVar3;
  IRKind IVar4;
  BOOLEAN BVar5;
  undefined4 *puVar6;
  Type_conflict node;
  Type *ppBVar7;
  Instr *pIVar8;
  BranchInstr *this_02;
  StackSym *pSVar9;
  Opnd *pOVar10;
  bool local_99;
  Instr *local_98;
  Instr *local_78;
  Instr *instr;
  Instr *instrStop;
  Instr *instrPrev;
  BasicBlock **bblock;
  Iterator __iter;
  anon_class_16_2_3f78c113 IsInductionVariableUse;
  Loop *loop_local;
  BackwardPass *this_local;
  
  IsInductionVariableUse.this = (BackwardPass *)loop;
  bVar3 = GlobOpt::HasMemOp(this->globOpt,loop);
  if (bVar3) {
    __iter.current = (NodeBase *)&IsInductionVariableUse.this;
    IsInductionVariableUse.loop = (Loop **)this;
    bVar3 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::HasTwo
                      ((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                       &(IsInductionVariableUse.this)->currentPrePassLoop);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                         ,0x239e,"(loop->blockList.HasTwo())","loop->blockList.HasTwo()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    _bblock = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::GetIterator
                        ((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                         &(IsInductionVariableUse.this)->currentPrePassLoop);
    while( true ) {
      if (__iter.list == (SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      this_01 = bblock;
      node = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar3 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                        ((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)this_01,node)
      ;
      if (bVar3) break;
      SListNodeBase<Memory::ArenaAllocator>::Next
                (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      ppBVar7 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)&bblock);
      if ((*(ushort *)&(*ppBVar7)->field_0x18 & 1) == 0) {
        pIVar8 = BasicBlock::GetLastInstr(*ppBVar7);
        if (pIVar8 == (Instr *)0x0) {
          local_98 = (Instr *)0x0;
        }
        else {
          pIVar8 = BasicBlock::GetLastInstr(*ppBVar7);
          local_98 = pIVar8->m_next;
        }
        pIVar8 = BasicBlock::GetFirstInstr(*ppBVar7);
LAB_004e60a1:
        local_78 = pIVar8;
        if (local_78 != local_98) {
          pIVar8 = local_78->m_next;
          IVar4 = IR::Instr::GetKind(local_78);
          local_99 = true;
          if (IVar4 != InstrKindLabel) {
            local_99 = IR::Instr::IsProfiledLabelInstr(local_78);
          }
          if ((((local_99 == false) && (bVar3 = IR::Instr::IsRealInstr(local_78), bVar3)) &&
              (local_78->m_opcode != IncrLoopBodyCount)) && (local_78->m_opcode != StLoopBodyCount))
          {
            bVar3 = IR::Instr::IsBranchInstr(local_78);
            if (bVar3) {
              this_02 = IR::Instr::AsBranchInstr(local_78);
              bVar3 = IR::BranchInstr::IsUnconditional(this_02);
              if (bVar3) goto LAB_004e60a1;
            }
            OVar1 = local_78->m_opcode;
            if (OVar1 != Nop) {
              if (1 < (ushort)(OVar1 - Incr_A)) {
                if (((ushort)(OVar1 - Add_I4) < 2) || (OVar1 == Ld_I4)) {
                  pOVar10 = IR::Instr::GetDst(local_78);
                  bVar3 = IsEmptyLoopAfterMemOp::anon_class_16_2_3f78c113::operator()
                                    ((anon_class_16_2_3f78c113 *)&__iter.current,pOVar10);
                  if (!bVar3) {
                    pOVar10 = IR::Instr::GetDst(local_78);
                    if (pOVar10 == (Opnd *)0x0) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                      *puVar6 = 1;
                      bVar3 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                                         ,0x23b6,"(instr->GetDst())","instr->GetDst()");
                      if (!bVar3) {
                        pcVar2 = (code *)invalidInstructionException();
                        (*pcVar2)();
                      }
                      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                      *puVar6 = 0;
                    }
                    pOVar10 = IR::Instr::GetDst(local_78);
                    pSVar9 = IR::Opnd::GetStackSym(pOVar10);
                    if (pSVar9 != (StackSym *)0x0) {
                      this_00 = (BVSparse<Memory::JitArenaAllocator> *)
                                (IsInductionVariableUse.this[2].func)->m_runtimeInfo;
                      pOVar10 = IR::Instr::GetDst(local_78);
                      pSVar9 = IR::Opnd::GetStackSym(pOVar10);
                      BVar5 = BVSparse<Memory::JitArenaAllocator>::Test
                                        (this_00,(pSVar9->super_Sym).m_id);
                      if (BVar5 != '\0') {
                        return false;
                      }
                    }
                  }
                  goto LAB_004e60a1;
                }
                bVar3 = IR::Instr::IsBranchInstr(local_78);
                if (bVar3) {
                  pOVar10 = IR::Instr::GetSrc1(local_78);
                  bVar3 = IsEmptyLoopAfterMemOp::anon_class_16_2_3f78c113::operator()
                                    ((anon_class_16_2_3f78c113 *)&__iter.current,pOVar10);
                  if (bVar3) goto LAB_004e60a1;
                  pOVar10 = IR::Instr::GetSrc2(local_78);
                  bVar3 = IsEmptyLoopAfterMemOp::anon_class_16_2_3f78c113::operator()
                                    ((anon_class_16_2_3f78c113 *)&__iter.current,pOVar10);
                  if (bVar3) goto LAB_004e60a1;
                }
                return false;
              }
              pOVar10 = IR::Instr::GetSrc1(local_78);
              bVar3 = IsEmptyLoopAfterMemOp::anon_class_16_2_3f78c113::operator()
                                ((anon_class_16_2_3f78c113 *)&__iter.current,pOVar10);
              if (!bVar3) {
                return false;
              }
            }
          }
          goto LAB_004e60a1;
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
BackwardPass::IsEmptyLoopAfterMemOp(Loop *loop)
{
    if (globOpt->HasMemOp(loop))
    {
        const auto IsInductionVariableUse = [&](IR::Opnd *opnd) -> bool
        {
            Loop::InductionVariableChangeInfo  inductionVariableChangeInfo = { 0, 0 };
            return (opnd &&
                opnd->GetStackSym() &&
                loop->memOpInfo->inductionVariableChangeInfoMap->ContainsKey(this->globOpt->GetVarSymID(opnd->GetStackSym())) &&
                (((Loop::InductionVariableChangeInfo)
                    loop->memOpInfo->inductionVariableChangeInfoMap->
                    LookupWithKey(this->globOpt->GetVarSymID(opnd->GetStackSym()), inductionVariableChangeInfo)).unroll != Js::Constants::InvalidLoopUnrollFactor));
        };

        Assert(loop->blockList.HasTwo());

        FOREACH_BLOCK_IN_LOOP(bblock, loop)
        {

            FOREACH_INSTR_IN_BLOCK_EDITING(instr, instrPrev, bblock)
            {
                if (instr->IsLabelInstr() || !instr->IsRealInstr() || instr->m_opcode == Js::OpCode::IncrLoopBodyCount || instr->m_opcode == Js::OpCode::StLoopBodyCount
                    || (instr->IsBranchInstr() && instr->AsBranchInstr()->IsUnconditional()))
                {
                    continue;
                }
                else
                {
                    switch (instr->m_opcode)
                    {
                    case Js::OpCode::Nop:
                        break;
                    case Js::OpCode::Ld_I4:
                    case Js::OpCode::Add_I4:
                    case Js::OpCode::Sub_I4:

                        if (!IsInductionVariableUse(instr->GetDst()))
                        {
                            Assert(instr->GetDst());
                            if (instr->GetDst()->GetStackSym()
                                && loop->memOpInfo->inductionVariablesUsedAfterLoop->Test(instr->GetDst()->GetStackSym()->m_id))
                            {
                                // We have use after the loop for a variable defined inside the loop. So the loop can't be removed.
                                return false;
                            }
                        }
                        break;
                    case Js::OpCode::Decr_A:
                    case Js::OpCode::Incr_A:
                        if (!IsInductionVariableUse(instr->GetSrc1()))
                        {
                            return false;
                        }
                        break;
                    default:
                        if (instr->IsBranchInstr())
                        {
                            if (IsInductionVariableUse(instr->GetSrc1()) || IsInductionVariableUse(instr->GetSrc2()))
                            {
                                break;
                            }
                        }
                        return false;
                    }
                }

            }
            NEXT_INSTR_IN_BLOCK_EDITING;

        }NEXT_BLOCK_IN_LIST;

        return true;
    }

    return false;
}